

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeStamp.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::TimeStamp::Encode(TimeStamp *this,KDataStream *stream)

{
  TimeStamp *self;
  
  if (this->m_bAutoCalcRel == true) {
    CalculateTimeStamp(this);
  }
  KDataStream::Write<unsigned_int>(stream,(this->m_TimeStampUnion).m_ui32TimeStamp);
  return;
}

Assistant:

void TimeStamp::Encode( KDataStream & stream ) const
{
    // Do we need to calculate the timestamp first?
    if( m_bAutoCalcRel )
    {
        // We need to cast away the const so we can make the change.
        TimeStamp * self = const_cast<TimeStamp*>( this );
        self->CalculateTimeStamp();
    }

    stream << m_TimeStampUnion.m_ui32TimeStamp;
}